

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<char>::concat(NFA<char> *this,NFA<char> *nfa)

{
  pointer pNVar1;
  int value;
  pointer src;
  pointer this_00;
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  *this_01;
  NFABaseState<char,_int> local_58;
  
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  src = (nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
        super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  this_00 = src + 1;
  value = (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                              super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
          -0x33333333 + -1;
  if (this_00 !=
      (nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
      super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = &(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states;
    do {
      NFABaseState<char,_int>::offset(&local_58,this_00,value);
      std::
      vector<Centaurus::NFABaseState<char,int>,std::allocator<Centaurus::NFABaseState<char,int>>>::
      emplace_back<Centaurus::NFABaseState<char,int>>
                ((vector<Centaurus::NFABaseState<char,int>,std::allocator<Centaurus::NFABaseState<char,int>>>
                  *)this_01,&local_58);
      local_58._vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_001bd088;
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::~vector(&local_58.m_transitions);
      this_00 = this_00 + 1;
    } while (this_00 !=
             (nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    pNVar1 = (this_01->
             super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    src = (nfa->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
          super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  NFABaseState<char,_int>::rebase_transitions(pNVar1 + value,src,value);
  return;
}

Assistant:

void concat(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[initial_size - 1].rebase_transitions(nfa.m_states[0], initial_size - 1);
    }